

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O3

sc_signed * sc_dt::operator*(sc_signed *__return_storage_ptr__,sc_signed *u,unsigned_long v)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  size_t __n;
  sc_length_param *psVar4;
  ulong uVar5;
  unsigned_long uVar6;
  sc_digit vd [3];
  
  uVar1 = u->sgn;
  if (v != 0 && uVar1 != 0) {
    __n = 0xc;
    uVar3 = 0;
    uVar6 = v;
    do {
      uVar5 = uVar3;
      vd[uVar5] = (uint)uVar6 & 0x3fffffff;
      __n = __n - 4;
      if (1 < uVar5) break;
      bVar2 = 0x3fffffff < uVar6;
      uVar3 = uVar5 + 1;
      uVar6 = uVar6 >> 0x1e;
    } while (bVar2);
    if (uVar5 < 2) {
      memset(vd + uVar5 + 1,0,__n);
    }
    mul_signed_friend(__return_storage_ptr__,(uint)(uVar1 == (v != 0)) * 2 + -1,u->nbits,u->ndigits,
                      u->digit,0x40,3,vd);
  }
  else {
    psVar4 = sc_context<sc_dt::sc_length_param>::default_value();
    sc_signed::sc_signed(__return_storage_ptr__,psVar4->m_len);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator*(const sc_signed& u, unsigned long v)
{

  small_type s = mul_signs(u.sgn, get_sign(v));

  if (s == SC_ZERO) // case 1
    return sc_signed();

  CONVERT_LONG_2(v);

  // else cases 2-4
  return mul_signed_friend(s, u.nbits, u.ndigits, u.digit,
                           BITS_PER_ULONG, DIGITS_PER_ULONG, vd);

}